

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InvocationBasicCase::genShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  byte bVar1;
  int iVar2;
  _anonymous_namespace_ *this_00;
  ostream *poVar3;
  char *code;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  ostringstream buf;
  Context *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [376];
  
  bVar1 = *(byte *)((long)this + 0x7c);
  iVar2 = *(int *)((long)this + 0x78);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"${GLSL_VERSION_DECL}\n",0x15);
  code = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
  pcVar5 = glcts::fixed_sample_locations_values + 1;
  bVar6 = (bVar1 & iVar2 == 1) != 0;
  if (bVar6) {
    pcVar5 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
  }
  lVar4 = 0x1f;
  if (!bVar6) {
    lVar4 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar5,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"layout (local_size_x=",0x15);
  poVar3 = (ostream *)std::ostream::operator<<(local_1a0,*(int *)((long)this + 0x88));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", local_size_y=",0xf);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)this + 0x8c));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"layout(binding=0, std430) buffer Output\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\thighp int values[];\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"} sb_result;\n",0xd);
  if (*(int *)((long)this + 0x78) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "layout(r32i, binding=1) coherent uniform highp iimage2D u_image;\n",0x41);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "highp ivec2 getCoord (in highp uvec2 localID, in highp int element)\n",0x44);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "\treturn ivec2(int(gl_WorkGroupID.x * gl_WorkGroupSize.x + localID.x), int(gl_WorkGroupID.y * gl_WorkGroupSize.y + localID.y) + element * "
               ,0x89);
    poVar3 = (ostream *)std::ostream::operator<<(local_1a0,*(int *)((long)this + 0x84));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,");\n",3);
  }
  else {
    if (*(int *)((long)this + 0x78) != 0) goto LAB_014bc36f;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"layout(binding=1, std430) coherent buffer Storage\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"\thighp int values[];\n",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"} sb_store;\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "highp int getIndex (in highp uvec2 localID, in highp int element)\n",0x42);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "\thighp uint groupNdx = gl_NumWorkGroups.x * gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
               ,0x51);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "\treturn int((localID.y * gl_NumWorkGroups.x * gl_NumWorkGroups.y * gl_WorkGroupSize.x) + (groupNdx * gl_WorkGroupSize.x) + localID.x) * "
               ,0x88);
    poVar3 = (ostream *)std::ostream::operator<<(local_1a0,*(int *)((long)this + 0x90));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," + element;\n",0xc);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
LAB_014bc36f:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "\tint resultNdx   = int(gl_GlobalInvocationID.y * gl_NumWorkGroups.x * gl_WorkGroupSize.x + gl_GlobalInvocationID.x);\n"
             ,0x75);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "\tint groupNdx    = int(gl_NumWorkGroups.x * gl_WorkGroupID.y + gl_WorkGroupID.x);\n",
             0x52);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"\tbool allOk      = true;\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  (**(code **)(*this + 0x30))(&local_1c0,this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(char *)local_1c0,local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\tsb_result.values[resultNdx] = (allOk) ? (1) : (0);\n",0x34);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
  if (local_1c0 != (Context *)local_1b0) {
    operator_delete(local_1c0,(ulong)((long)(Platform **)local_1b0._0_8_ + 1));
  }
  this_00 = *(_anonymous_namespace_ **)((long)this + 0x70);
  std::__cxx11::stringbuf::str();
  specializeShader_abi_cxx11_(__return_storage_ptr__,this_00,local_1c0,code);
  if (local_1c0 != (Context *)local_1b0) {
    operator_delete(local_1c0,(ulong)((long)(Platform **)local_1b0._0_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string InvocationBasicCase::genShaderSource (void) const
{
	const bool			useImageAtomics = m_useAtomic && m_storage == STORAGE_IMAGE;
	std::ostringstream	buf;

	buf << "${GLSL_VERSION_DECL}\n"
		<< ((useImageAtomics) ? ("${SHADER_IMAGE_ATOMIC_REQUIRE}\n") : (""))
		<< "layout (local_size_x=" << m_localWidth << ", local_size_y=" << m_localHeight << ") in;\n"
		<< "layout(binding=0, std430) buffer Output\n"
		<< "{\n"
		<< "	highp int values[];\n"
		<< "} sb_result;\n";

	if (m_storage == STORAGE_BUFFER)
		buf << "layout(binding=1, std430) coherent buffer Storage\n"
			<< "{\n"
			<< "	highp int values[];\n"
			<< "} sb_store;\n"
			<< "\n"
			<< "highp int getIndex (in highp uvec2 localID, in highp int element)\n"
			<< "{\n"
			<< "	highp uint groupNdx = gl_NumWorkGroups.x * gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
			<< "	return int((localID.y * gl_NumWorkGroups.x * gl_NumWorkGroups.y * gl_WorkGroupSize.x) + (groupNdx * gl_WorkGroupSize.x) + localID.x) * " << m_elementsPerInvocation << " + element;\n"
			<< "}\n";
	else if (m_storage == STORAGE_IMAGE)
		buf << "layout(r32i, binding=1) coherent uniform highp iimage2D u_image;\n"
			<< "\n"
			<< "highp ivec2 getCoord (in highp uvec2 localID, in highp int element)\n"
			<< "{\n"
			<< "	return ivec2(int(gl_WorkGroupID.x * gl_WorkGroupSize.x + localID.x), int(gl_WorkGroupID.y * gl_WorkGroupSize.y + localID.y) + element * " << m_workHeight << ");\n"
			<< "}\n";
	else
		DE_ASSERT(DE_FALSE);

	buf << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	int resultNdx   = int(gl_GlobalInvocationID.y * gl_NumWorkGroups.x * gl_WorkGroupSize.x + gl_GlobalInvocationID.x);\n"
		<< "	int groupNdx    = int(gl_NumWorkGroups.x * gl_WorkGroupID.y + gl_WorkGroupID.x);\n"
		<< "	bool allOk      = true;\n"
		<< "\n"
		<< genShaderMainBlock()
		<< "\n"
		<< "	sb_result.values[resultNdx] = (allOk) ? (1) : (0);\n"
		<< "}\n";

	return specializeShader(m_context, buf.str().c_str());
}